

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_queue.cpp
# Opt level: O3

bool __thiscall miniros::CallbackQueue::isEnabled(CallbackQueue *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    bVar1 = this->enabled_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool CallbackQueue::isEnabled()
{
  std::scoped_lock<std::mutex> lock(mutex_);

  return enabled_;
}